

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleText(SVGTextFragmentsBuilder *this,SVGTextNode *node)

{
  bool bVar1;
  _Bool _Var2;
  WhiteSpace WVar3;
  int length;
  ulong uVar4;
  SVGElement *node_00;
  reference pvVar5;
  void *text_00;
  size_type sVar6;
  size_type local_60;
  char32_t local_54;
  undefined1 local_50 [4];
  plutovg_codepoint_t currentCharacter;
  plutovg_text_iterator_t it;
  size_type sStack_30;
  uint32_t lastCharacter;
  size_type startOffset;
  SVGTextPositioningElement *element;
  string *text;
  SVGTextNode *node_local;
  SVGTextFragmentsBuilder *this_local;
  
  text = (string *)node;
  node_local = (SVGTextNode *)this;
  element = (SVGTextPositioningElement *)SVGTextNode::data_abi_cxx11_(node);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    node_00 = SVGNode::parentElement((SVGNode *)text);
    startOffset = (size_type)toSVGTextPositioningElement(&node_00->super_SVGNode);
    sStack_30 = std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                length(this->m_text);
    it._20_4_ = 0x20;
    bVar1 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                      (this->m_text);
    if (!bVar1) {
      pvVar5 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::back
                         (this->m_text);
      it._20_4_ = *pvVar5;
    }
    text_00 = (void *)std::__cxx11::string::data();
    length = std::__cxx11::string::length();
    plutovg_text_iterator_init
              ((plutovg_text_iterator_t *)local_50,text_00,length,PLUTOVG_TEXT_ENCODING_UTF8);
    while (_Var2 = plutovg_text_iterator_has_next((plutovg_text_iterator_t *)local_50),
          uVar4 = sStack_30, _Var2) {
      local_54 = plutovg_text_iterator_next((plutovg_text_iterator_t *)local_50);
      if (((local_54 == L'\t') || (local_54 == L'\n')) || (local_54 == L'\r')) {
        local_54 = L' ';
      }
      if (((local_54 != L' ') || (it._20_4_ != 0x20)) ||
         (WVar3 = SVGTextPositioningElement::white_space((SVGTextPositioningElement *)startOffset),
         WVar3 != Default)) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(this->m_text,local_54);
        it._20_4_ = local_54;
      }
    }
    sVar6 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                      (this->m_text);
    if (uVar4 < sVar6) {
      local_60 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 length(this->m_text);
      std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
      emplace_back<lunasvg::SVGTextNode_const*&,unsigned_long_const&,unsigned_long>
                ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
                 &this->m_textPositions,(SVGTextNode **)&text,&stack0xffffffffffffffd0,&local_60);
    }
  }
  return;
}

Assistant:

void SVGTextFragmentsBuilder::handleText(const SVGTextNode* node)
{
    const auto& text = node->data();
    if(text.empty())
        return;
    auto element = toSVGTextPositioningElement(node->parentElement());
    const auto startOffset = m_text.length();
    uint32_t lastCharacter = ' ';
    if(!m_text.empty()) {
        lastCharacter = m_text.back();
    }

    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text.data(), text.length(), PLUTOVG_TEXT_ENCODING_UTF8);
    while(plutovg_text_iterator_has_next(&it)) {
        auto currentCharacter = plutovg_text_iterator_next(&it);
        if(currentCharacter == '\t' || currentCharacter == '\n' || currentCharacter == '\r')
            currentCharacter = ' ';
        if(currentCharacter == ' ' && lastCharacter == ' ' && element->white_space() == WhiteSpace::Default)
            continue;
        m_text.push_back(currentCharacter);
        lastCharacter = currentCharacter;
    }

    if(startOffset < m_text.length()) {
        m_textPositions.emplace_back(node, startOffset, m_text.length());
    }
}